

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::TextureStorage<1u,false>
          (StorageAndSubImageTest *this,GLenum target,GLuint texture,GLsizei levels,
          GLenum internalformat,GLsizei width,GLsizei height,GLsizei depth)

{
  ostringstream *this_00;
  RenderContext *pRVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 in_register_00000034;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*pRVar1->_vptr_RenderContext[3])(pRVar1,CONCAT44(in_register_00000034,target));
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1440))(texture,levels,internalformat,width);
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  if (iVar2 != 0) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"glTextureStorage1D unexpectedly generated error ",0x30);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," during test with levels ",0x19);
    std::ostream::operator<<(this_00,levels);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", internal format ",0x12)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," and width ",0xb);
    std::ostream::operator<<(this_00,width);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    if (this->m_to != 0) {
      (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x480))(1,&this->m_to);
      this->m_to = 0;
    }
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    do {
      iVar4 = (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x800))();
    } while (iVar4 != 0);
  }
  return iVar2 == 0;
}

Assistant:

bool StorageAndSubImageTest::TextureStorage<1, false>(glw::GLenum target, glw::GLuint texture, glw::GLsizei levels,
													  glw::GLenum internalformat, glw::GLsizei width,
													  glw::GLsizei height, glw::GLsizei depth)
{
	(void)target;
	(void)height;
	(void)depth;
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Preparing storage. */
	gl.textureStorage1D(texture, levels, internalformat, width);

	/* Error checking. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		/* Log. */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glTextureStorage1D unexpectedly generated error " << glu::getErrorStr(error)
			<< " during test with levels " << levels << ", internal format " << internalformat << " and width " << width
			<< "." << tcu::TestLog::EndMessage;

		CleanTexture();
		CleanErrors();

		return false;
	}

	return true;
}